

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altsvc.c
# Opt level: O0

CURLcode Curl_altsvc_save(Curl_easy *data,altsvcinfo *altsvc,char *file)

{
  int iVar1;
  altsvc *as_00;
  altsvc *as;
  Curl_llist_node *n;
  Curl_llist_node *e;
  char *tempstore;
  FILE *out;
  char *pcStack_28;
  CURLcode result;
  char *file_local;
  altsvcinfo *altsvc_local;
  Curl_easy *data_local;
  
  out._4_4_ = 0;
  e = (Curl_llist_node *)0x0;
  if (altsvc == (altsvcinfo *)0x0) {
    data_local._4_4_ = CURLE_OK;
  }
  else {
    pcStack_28 = file;
    if ((file == (char *)0x0) && (altsvc->filename != (char *)0x0)) {
      pcStack_28 = altsvc->filename;
    }
    if ((((altsvc->flags & 4U) == 0) && (pcStack_28 != (char *)0x0)) && (*pcStack_28 != '\0')) {
      file_local = (char *)altsvc;
      altsvc_local = (altsvcinfo *)data;
      out._4_4_ = Curl_fopen(data,pcStack_28,(FILE **)&tempstore,(char **)&e);
      if (out._4_4_ == CURLE_OK) {
        fputs("# Your alt-svc cache. https://curl.se/docs/alt-svc.html\n# This file was generated by libcurl! Edit at your own risk.\n"
              ,(FILE *)tempstore);
        n = Curl_llist_head((Curl_llist *)(file_local + 8));
        do {
          if (n == (Curl_llist_node *)0x0) break;
          as_00 = (altsvc *)Curl_node_elem(n);
          n = Curl_node_next(n);
          out._4_4_ = altsvc_out(as_00,(FILE *)tempstore);
        } while (out._4_4_ == CURLE_OK);
        fclose((FILE *)tempstore);
        if (((out._4_4_ == CURLE_OK) && (e != (Curl_llist_node *)0x0)) &&
           (iVar1 = Curl_rename((char *)e,pcStack_28), iVar1 != 0)) {
          out._4_4_ = CURLE_WRITE_ERROR;
        }
        if ((out._4_4_ != CURLE_OK) && (e != (Curl_llist_node *)0x0)) {
          unlink((char *)e);
        }
      }
      (*Curl_cfree)(e);
      data_local._4_4_ = out._4_4_;
    }
    else {
      data_local._4_4_ = CURLE_OK;
    }
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_altsvc_save(struct Curl_easy *data,
                          struct altsvcinfo *altsvc, const char *file)
{
  CURLcode result = CURLE_OK;
  FILE *out;
  char *tempstore = NULL;

  if(!altsvc)
    /* no cache activated */
    return CURLE_OK;

  /* if not new name is given, use the one we stored from the load */
  if(!file && altsvc->filename)
    file = altsvc->filename;

  if((altsvc->flags & CURLALTSVC_READONLYFILE) || !file || !file[0])
    /* marked as read-only, no file or zero length filename */
    return CURLE_OK;

  result = Curl_fopen(data, file, &out, &tempstore);
  if(!result) {
    struct Curl_llist_node *e;
    struct Curl_llist_node *n;
    fputs("# Your alt-svc cache. https://curl.se/docs/alt-svc.html\n"
          "# This file was generated by libcurl! Edit at your own risk.\n",
          out);
    for(e = Curl_llist_head(&altsvc->list); e; e = n) {
      struct altsvc *as = Curl_node_elem(e);
      n = Curl_node_next(e);
      result = altsvc_out(as, out);
      if(result)
        break;
    }
    fclose(out);
    if(!result && tempstore && Curl_rename(tempstore, file))
      result = CURLE_WRITE_ERROR;

    if(result && tempstore)
      unlink(tempstore);
  }
  free(tempstore);
  return result;
}